

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

void mp_next(char **data)

{
  byte bVar1;
  int iVar2;
  uint8_t len;
  int l;
  uint8_t c;
  int64_t k;
  char **data_local;
  
  _l = 1;
  do {
    if (_l < 1) {
      return;
    }
    bVar1 = mp_load_u8(data);
    iVar2 = (int)""[bVar1];
    if (iVar2 < 0) {
      if (bVar1 == 0xd9) {
        bVar1 = mp_load_u8(data);
        *data = *data + (int)(uint)bVar1;
      }
      else {
        if (iVar2 < -0x1f) {
          *data = *data + -1;
          mp_next_slowpath(data,_l);
          return;
        }
        _l = _l - iVar2;
      }
    }
    else {
      *data = *data + iVar2;
    }
    _l = _l + -1;
  } while( true );
}

Assistant:

MP_IMPL void
mp_next(const char **data)
{
	int64_t k = 1;
	for (; k > 0; k--) {
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			*data += l;
			continue;
		} else if (mp_likely(c == 0xd9)){
			/* MP_STR (8) */
			uint8_t len = mp_load_u8(data);
			*data += len;
			continue;
		} else if (l > MP_HINT) {
			k -= l;
			continue;
		} else {
			*data -= sizeof(uint8_t);
			mp_next_slowpath(data, k);
			return;
		}
	}
}